

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall FIX::FieldBase::FieldBase(FieldBase *this,int tag,string *string)

{
  field_metrics fVar1;
  string *string_local;
  int tag_local;
  FieldBase *this_local;
  
  this->_vptr_FieldBase = (_func_int **)&PTR__FieldBase_00189c30;
  this->m_tag = tag;
  std::__cxx11::string::string((string *)&this->m_string,(string *)string);
  std::__cxx11::string::string((string *)&this->m_data);
  fVar1 = no_metrics();
  this->m_metrics = fVar1;
  return;
}

Assistant:

FieldBase(int tag, const std::string &string)
      : m_tag(tag),
        m_string(string),
        m_metrics(no_metrics()) {}